

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesTemperatureGetState(zes_temp_handle_t hTemperature,double *pTemperature)

{
  zes_pfnTemperatureGetState_t pfnGetState;
  dditable_t *dditable;
  ze_result_t result;
  double *pTemperature_local;
  zes_temp_handle_t hTemperature_local;
  
  if (*(code **)(*(long *)(hTemperature + 8) + 0xc30) == (code *)0x0) {
    hTemperature_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hTemperature_local._4_4_ =
         (**(code **)(*(long *)(hTemperature + 8) + 0xc30))
                   (*(undefined8 *)hTemperature,pTemperature);
  }
  return hTemperature_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesTemperatureGetState(
        zes_temp_handle_t hTemperature,                 ///< [in] Handle for the component.
        double* pTemperature                            ///< [in,out] Will contain the temperature read from the specified sensor
                                                        ///< in degrees Celsius.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_temp_object_t*>( hTemperature )->dditable;
        auto pfnGetState = dditable->zes.Temperature.pfnGetState;
        if( nullptr == pfnGetState )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hTemperature = reinterpret_cast<zes_temp_object_t*>( hTemperature )->handle;

        // forward to device-driver
        result = pfnGetState( hTemperature, pTemperature );

        return result;
    }